

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1cod.c
# Opt level: O2

void jpc_initluts(void)

{
  int i;
  int iVar1;
  uint_least8_t *puVar2;
  _Bool *p_Var3;
  uint uVar4;
  jpc_mqctx_t *ctx;
  jpc_mqctx_t *pjVar5;
  long lVar6;
  uint uVar7;
  undefined4 uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int_fast16_t iVar12;
  int iVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  
  pjVar5 = jpc_mqctxs;
  for (iVar1 = 0; iVar1 != 0x13; iVar1 = iVar1 + 1) {
    pjVar5->mps = false;
    iVar12 = 3;
    if (((iVar1 != 0) && (iVar12 = 0x2e, iVar1 != 0x12)) && (iVar12 = 4, iVar1 != 1)) {
      iVar12 = 0;
    }
    pjVar5->ind = iVar12;
    pjVar5 = pjVar5 + 1;
  }
  puVar2 = jpc_zcctxnolut;
  lVar6 = 0;
  uVar8 = 4;
  do {
    uVar4 = (uint)lVar6;
    if (lVar6 == 4) {
      p_Var3 = jpc_spblut;
      for (lVar6 = 0; lVar6 != 0x1000; lVar6 = lVar6 + 0x10) {
        uVar4 = (uint)lVar6;
        iVar13 = -(uint)((uVar4 & 0x880) == 0x80 || (uVar4 & 0x220) == 0x20);
        iVar26 = -(uint)((uVar4 & 0x440) == 0x40 || (uVar4 & 0x110) == 0x10);
        auVar25._4_4_ = iVar13;
        auVar25._0_4_ = iVar13;
        auVar25._8_4_ = iVar26;
        auVar25._12_4_ = iVar26;
        iVar11 = -(uint)((uVar4 & 0x880) == 0x880 || (uVar4 & 0x220) == 0x220);
        iVar16 = -(uint)((uVar4 & 0x440) == 0x440 || (uVar4 & 0x110) == 0x110);
        auVar24._4_4_ = iVar11;
        auVar24._0_4_ = iVar11;
        auVar24._8_4_ = iVar16;
        auVar24._12_4_ = iVar16;
        iVar1 = movmskpd(uVar8,auVar24 ^ auVar25);
        uVar8 = CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != 0);
        *p_Var3 = (_Bool)(((byte)iVar11 | (byte)iVar13 ^ 1) & iVar1 != 0 &
                         ((byte)iVar16 | (byte)iVar26 ^ 1 | SUB161(auVar24 ^ auVar25,0)));
        p_Var3 = p_Var3 + 1;
      }
      puVar2 = jpc_scctxnolut;
      for (lVar6 = 0; uVar4 = (uint)lVar6, lVar6 != 0x1000; lVar6 = lVar6 + 0x10) {
        iVar1 = (uint)((uVar4 & 0x440) == 0x40 || (uVar4 & 0x110) == 0x10) -
                (uint)((uVar4 & 0x440) == 0x440 || (uVar4 & 0x110) == 0x110);
        uVar7 = (uint)((uVar4 & 0x880) == 0x880 || (uVar4 & 0x220) == 0x220);
        uVar4 = (uint)((uVar4 & 0x880) == 0x80 || (uVar4 & 0x220) == 0x20);
        if (uVar4 == uVar7) {
          bVar14 = 0xe - (iVar1 == 0);
        }
        else {
          iVar11 = -iVar1;
          if (-1 < (int)(uVar4 - uVar7)) {
            iVar11 = iVar1;
          }
          bVar14 = iVar11 == 0 ^ 0x11;
          if (iVar11 == -1) {
            bVar14 = 0xf;
          }
        }
        *puVar2 = bVar14;
        puVar2 = puVar2 + 1;
      }
      puVar2 = jpc_magctxnolut;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        for (lVar9 = 0; lVar9 != 0x800; lVar9 = lVar9 + 1) {
          bVar14 = (char)lVar9 == '\0' ^ 0xb;
          if (lVar6 != 0) {
            bVar14 = 0xc;
          }
          puVar2[lVar9] = bVar14;
        }
        puVar2 = puVar2 + 0x800;
      }
      dVar19 = jpc_pow2i(-6);
      dVar20 = jpc_pow2i(6);
      for (uVar10 = 0; uVar10 != 0x80; uVar10 = uVar10 + 1) {
        fVar22 = (float)((double)(int)uVar10 * dVar19);
        fVar18 = fVar22 + -1.5;
        dVar21 = floor((double)(fVar22 * fVar22 - fVar18 * fVar18) * dVar20 + 0.5);
        jpc_signmsedec[uVar10] = (long)((dVar21 / dVar20) * 8192.0);
        dVar21 = floor((double)(fVar22 * fVar22) * dVar20 + 0.5);
        jpc_signmsedec0[uVar10] = (long)((dVar21 / dVar20) * 8192.0);
        fVar23 = fVar22 + -0.5;
        if (0x3f < uVar10) {
          fVar23 = fVar18;
        }
        fVar18 = (fVar22 + -1.0) * (fVar22 + -1.0);
        dVar21 = floor((double)(fVar18 - fVar23 * fVar23) * dVar20 + 0.5);
        jpc_refnmsedec[uVar10] = (long)((dVar21 / dVar20) * 8192.0);
        dVar21 = floor((double)fVar18 * dVar20 + 0.5);
        jpc_refnmsedec0[uVar10] = (long)((dVar21 / dVar20) * 8192.0);
      }
      return;
    }
    for (uVar10 = 0; uVar10 != 0x100; uVar10 = uVar10 + 1) {
      uVar7 = (uint)uVar10;
      iVar13 = ((uint)(uVar10 >> 7) & 0x1ffffff) + (uint)((uVar7 >> 5 & 1) != 0);
      iVar1 = ((uint)(uVar10 >> 4) & 1) + (uint)((uVar7 >> 6 & 1) != 0);
      uVar15 = (uVar7 & 1) + (uint)((uVar7 >> 3 & 1) != 0);
      iVar11 = ((uint)(uVar10 >> 1) & 1) + uVar15 + (uint)((uVar7 >> 2 & 1) != 0);
      iVar16 = iVar13;
      if (uVar4 < 2) {
LAB_00125f96:
        if (iVar16 == 1) {
          uVar15 = 8;
          if (iVar1 == 0) {
            uVar15 = (uint)(iVar11 == 0 ^ 7);
          }
        }
        else {
          uVar15 = 9;
          if (iVar16 == 0) {
            if (iVar1 == 1) {
              uVar15 = 4;
            }
            else if (iVar1 == 0) {
LAB_00126004:
              uVar15 = (uint)(iVar11 == 1 ^ 3);
              if (iVar11 == 0) {
                uVar15 = 1;
              }
            }
            else {
              uVar15 = 5;
            }
          }
        }
      }
      else if (uVar4 == 3) {
        iVar13 = iVar13 + iVar1;
        if (iVar11 == 2) {
          uVar15 = (uint)(byte)(8 - (iVar13 == 0));
        }
        else if (iVar11 == 1) {
          uVar15 = (uint)(byte)(6 - (iVar13 == 1));
          if (iVar13 == 0) {
            uVar15 = 4;
          }
        }
        else {
          uVar15 = 9;
          bVar17 = iVar11 == 0;
          iVar11 = iVar13;
          if (bVar17) goto LAB_00126004;
        }
      }
      else {
        iVar16 = iVar1;
        iVar1 = iVar13;
        if (uVar4 == 2) goto LAB_00125f96;
      }
      puVar2[uVar10] = (uint_least8_t)uVar15;
    }
    lVar6 = lVar6 + 1;
    puVar2 = puVar2 + 0x100;
  } while( true );
}

Assistant:

void jpc_initluts()
{
	int i;
	int orient;
	int refine;
	float u;
	float v;
	float t;

/* XXX - hack */
jpc_initmqctxs();

	for (orient = 0; orient < 4; ++orient) {
		for (i = 0; i < 256; ++i) {
			jpc_zcctxnolut[(orient << 8) | i] = jpc_getzcctxno(i, orient);
		}
	}

	for (i = 0; i < 256; ++i) {
		jpc_spblut[i] = jpc_getspb(i << 4);
	}

	for (i = 0; i < 256; ++i) {
		jpc_scctxnolut[i] = jpc_getscctxno(i << 4);
	}

	for (refine = 0; refine < 2; ++refine) {
		for (i = 0; i < 2048; ++i) {
			jpc_magctxnolut[(refine << 11) + i] = jpc_getmagctxno((refine ? JPC_REFINE : 0) | i);
		}
	}

	for (i = 0; i < (1 << JPC_NMSEDEC_BITS); ++i) {
		t = i * jpc_pow2i(-JPC_NMSEDEC_FRACBITS);
		u = t;
		v = t - 1.5;
		jpc_signmsedec[i] = jpc_dbltofix(floor((u * u - v * v) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
/* XXX - this calc is not correct */
		jpc_signmsedec0[i] = jpc_dbltofix(floor((u * u) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
		u = t - 1.0;
		if (i & (1 << (JPC_NMSEDEC_BITS - 1))) {
			v = t - 1.5;
		} else {
			v = t - 0.5;
		}
		jpc_refnmsedec[i] = jpc_dbltofix(floor((u * u - v * v) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
/* XXX - this calc is not correct */
		jpc_refnmsedec0[i] = jpc_dbltofix(floor((u * u) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
	}
}